

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O1

uint8_t __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
tagsOffset(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this,uint8_t *start)

{
  byte bVar1;
  uint uVar2;
  uint8_t uVar3;
  
  uVar3 = '\0';
  do {
    bVar1 = *start;
    if ((bVar1 & 0xfe) != 0xee) {
      return uVar3;
    }
    uVar2 = (uint)(bVar1 == 0xef) * 9;
    if (bVar1 == 0xee) {
      uVar2 = 2;
    }
    uVar3 = uVar3 + (char)uVar2;
    start = start + uVar2;
  } while (uVar2 != 0);
  return uVar3;
}

Assistant:

uint8_t tagsOffset(uint8_t const* start) const noexcept {
    uint8_t ret = 0;

    while (SliceStaticData::TypeMap[*start] == ValueType::Tagged) {
      uint8_t offset = tagOffset(start);
      VELOCYPACK_ASSERT(offset != 0);
      if (VELOCYPACK_UNLIKELY(offset == 0)) {
        // prevent endless loop
        break;
      }
      ret += offset;
      start += offset;
    }

    return ret;
  }